

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BN.cpp
# Opt level: O0

BN * __thiscall BN::operator--(BN *this)

{
  bool bVar1;
  reference puVar2;
  unsigned_short *i;
  iterator __end1;
  iterator __begin1;
  vector<unsigned_short,_std::allocator<unsigned_short>_> *__range1;
  BN *this_local;
  
  __end1 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::begin(&this->ba);
  i = (unsigned_short *)std::vector<unsigned_short,_std::allocator<unsigned_short>_>::end(&this->ba)
  ;
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<unsigned_short_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>
                                *)&i);
    if (!bVar1) {
      anon_unknown.dwarf_977c::Norm(&this->ba);
      return this;
    }
    puVar2 = __gnu_cxx::
             __normal_iterator<unsigned_short_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>
             ::operator*(&__end1);
    if (*puVar2 != 0) break;
    *puVar2 = *puVar2 - 1;
    __gnu_cxx::
    __normal_iterator<unsigned_short_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>
    ::operator++(&__end1);
  }
  *puVar2 = *puVar2 - 1;
  return this;
}

Assistant:

BN & BN::operator --() noexcept
{
    for (auto& i : ba) {
        if (i) {
            --i;
            return *this;
        }
        --i;
    }
    Norm(ba);

    return *this;
}